

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_bool32 ma_is_loopback_supported(ma_backend_conflict backend)

{
  ma_bool32 local_c;
  ma_backend_conflict backend_local;
  
  switch(backend) {
  case ma_backend_wasapi:
    local_c = 1;
    break;
  case ma_backend_dsound:
    local_c = 0;
    break;
  case ma_backend_winmm:
    local_c = 0;
    break;
  case ma_backend_coreaudio:
    local_c = 0;
    break;
  case ma_backend_sndio:
    local_c = 0;
    break;
  case ma_backend_audio4:
    local_c = 0;
    break;
  case ma_backend_oss:
    local_c = 0;
    break;
  case ma_backend_pulseaudio:
    local_c = 0;
    break;
  case ma_backend_alsa:
    local_c = 0;
    break;
  case ma_backend_jack:
    local_c = 0;
    break;
  case ma_backend_aaudio:
    local_c = 0;
    break;
  case ma_backend_opensl:
    local_c = 0;
    break;
  case ma_backend_webaudio:
    local_c = 0;
    break;
  case ma_backend_custom:
    local_c = 0;
    break;
  case ma_backend_null:
    local_c = 0;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

MA_API ma_bool32 ma_is_loopback_supported(ma_backend backend)
{
    switch (backend)
    {
        case ma_backend_wasapi:     return MA_TRUE;
        case ma_backend_dsound:     return MA_FALSE;
        case ma_backend_winmm:      return MA_FALSE;
        case ma_backend_coreaudio:  return MA_FALSE;
        case ma_backend_sndio:      return MA_FALSE;
        case ma_backend_audio4:     return MA_FALSE;
        case ma_backend_oss:        return MA_FALSE;
        case ma_backend_pulseaudio: return MA_FALSE;
        case ma_backend_alsa:       return MA_FALSE;
        case ma_backend_jack:       return MA_FALSE;
        case ma_backend_aaudio:     return MA_FALSE;
        case ma_backend_opensl:     return MA_FALSE;
        case ma_backend_webaudio:   return MA_FALSE;
        case ma_backend_custom:     return MA_FALSE;    /* <-- Will depend on the implementation of the backend. */
        case ma_backend_null:       return MA_FALSE;
        default:                    return MA_FALSE;
    }
}